

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O1

void __thiscall Assimp::D3MF::XmlSerializer::ReadBaseMaterials(XmlSerializer *this)

{
  _Rb_tree_header *p_Var1;
  pointer ppaVar2;
  pointer ppaVar3;
  int iVar4;
  _Rb_tree_color _Var5;
  undefined4 extraout_var;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  _Base_ptr *__x;
  bool bVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> MatIdArray;
  uint id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  aiMaterial *local_30;
  uint local_24;
  
  __x = (_Base_ptr *)&local_48;
  pmVar6 = &local_48;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar4 = (*this->xmlReader->_vptr_IIrrXMLReader[7])
                    (this->xmlReader,XmlTag::basematerials_id_abi_cxx11_);
  if ((char *)CONCAT44(extraout_var,iVar4) != (char *)0x0) {
    _Var5 = atoi((char *)CONCAT44(extraout_var,iVar4));
    local_30 = (aiMaterial *)CONCAT44(local_30._4_4_,_Var5);
    ppaVar2 = (this->mMatArray).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppaVar3 = (this->mMatArray).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (_Var5 != this->mActiveMatGroup) {
      this->mActiveMatGroup = _Var5;
      p_Var1 = &(this->mMatId2MatArray)._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = (this->mMatId2MatArray)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = &p_Var1->_M_header;
      for (; p_Var8 != (_Base_ptr)0x0; p_Var8 = (&p_Var8->_M_left)[bVar9]) {
        bVar9 = p_Var8[1]._M_color < _Var5;
        if (!bVar9) {
          p_Var7 = p_Var8;
        }
      }
      p_Var8 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var7 != p_Var1) && (p_Var8 = p_Var7, _Var5 < p_Var7[1]._M_color)) {
        p_Var8 = &p_Var1->_M_header;
      }
      if (p_Var1 == (_Rb_tree_header *)p_Var8) {
        if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        pmVar6 = std::
                 map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                 ::operator[](&this->mMatId2MatArray,(key_type *)&local_30);
      }
      else {
        __x = &p_Var8[1]._M_parent;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (pmVar6,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x);
    }
    local_24 = (uint)((ulong)((long)ppaVar2 - (long)ppaVar3) >> 3);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&local_48,&local_24);
    pmVar6 = std::
             map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::operator[](&this->mMatId2MatArray,&this->mActiveMatGroup);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pmVar6,&local_48);
  }
  while (bVar9 = ReadToEndElement(this,(string *)&XmlTag::basematerials_abi_cxx11_), bVar9) {
    local_30 = readMaterialDef(this);
    std::vector<aiMaterial*,std::allocator<aiMaterial*>>::emplace_back<aiMaterial*>
              ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)&this->mMatArray,&local_30);
  }
  if ((_Base_ptr)
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ReadBaseMaterials() {
        std::vector<unsigned int> MatIdArray;
        const char *baseMaterialId( xmlReader->getAttributeValue( D3MF::XmlTag::basematerials_id.c_str() ) );
        if ( nullptr != baseMaterialId ) {
            unsigned int id = std::atoi( baseMaterialId );
            const size_t newMatIdx( mMatArray.size() );
            if ( id != mActiveMatGroup ) {
                mActiveMatGroup = id;
                MatId2MatArray::const_iterator it( mMatId2MatArray.find( id ) );
                if ( mMatId2MatArray.end() == it ) {
                    MatIdArray.clear();
                    mMatId2MatArray[ id ] = MatIdArray;
                } else {
                    MatIdArray = it->second;
                }
            }
            MatIdArray.push_back( static_cast<unsigned int>( newMatIdx ) );
            mMatId2MatArray[ mActiveMatGroup ] = MatIdArray;
        }

        while ( ReadToEndElement( D3MF::XmlTag::basematerials ) ) {
            mMatArray.push_back( readMaterialDef() );
        }
    }